

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_descriptor
                  (_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp,int *fds,size_t nfds)

{
  ulong uVar1;
  int *piVar2;
  uint8_t *p;
  
  if (nvp->nvp_type != 6) {
    __assert_fail("nvp->nvp_type == 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x333,
                  "const unsigned char *nvpair_unpack_descriptor(_Bool, nvpair_t *, const unsigned char *, size_t *, const int *, size_t)"
                 );
  }
  if ((nvp->nvp_datasize == 8) && (7 < *leftp)) {
    if (isbe) {
      uVar1 = be64dec(ptr);
    }
    else {
      uVar1 = *(ulong *)ptr;
    }
    if ((-1 < (long)uVar1) && (uVar1 < nfds)) {
      nvp->nvp_data = (long)fds[uVar1];
      *leftp = *leftp - 8;
      return ptr + 8;
    }
  }
  piVar2 = __errno_location();
  *piVar2 = 0x16;
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_descriptor(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
    size_t *leftp, const int *fds, size_t nfds)
{
	int64_t idx;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_DESCRIPTOR);

	if (nvp->nvp_datasize != sizeof(idx)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}
	if (*leftp < sizeof(idx)) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if (isbe)
		idx = be64dec(ptr);
	else
		idx = le64dec(ptr);

	if (idx < 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	if ((size_t)idx >= nfds) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	nvp->nvp_data = (uint64_t)fds[idx];

	ptr += sizeof(idx);
	*leftp -= sizeof(idx);

	return (ptr);
}